

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_entry.c
# Opt level: O0

wchar_t * archive_entry_sourcepath_w(archive_entry *entry)

{
  wchar_t wVar1;
  archive_entry *local_20;
  wchar_t *p;
  archive_entry *entry_local;
  
  p = (wchar_t *)entry;
  wVar1 = archive_mstring_get_wcs(entry->archive,&entry->ae_sourcepath,(wchar_t **)&local_20);
  if (wVar1 == L'\0') {
    entry_local = local_20;
  }
  else {
    entry_local = (archive_entry *)0x0;
  }
  return (wchar_t *)entry_local;
}

Assistant:

const wchar_t *
archive_entry_sourcepath_w(struct archive_entry *entry)
{
	const wchar_t *p;
	if (archive_mstring_get_wcs(
	    entry->archive, &entry->ae_sourcepath, &p) == 0)
		return (p);
	return (NULL);
}